

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fftopn(fitsfile **fptr,char *name,int mode,int *status)

{
  uint uVar1;
  int iVar2;
  int hdutype;
  undefined8 uStack_18;
  
  uVar1 = *status;
  uStack_18 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  *status = -0x67;
  ffopen(fptr,name,mode,status);
  iVar2 = ffghdt(*fptr,(int *)((long)&uStack_18 + 4),status);
  if ((iVar2 < 1) && (uStack_18._4_4_ == 0)) {
    *status = 0xeb;
  }
  return *status;
}

Assistant:

int fftopn(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access. and
  move to the first HDU that contains 'interesting' table (not an image). 
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    *status = SKIP_IMAGE;

    ffopen(fptr, name, mode, status);

    if (ffghdt(*fptr, &hdutype, status) <= 0) {
        if (hdutype == IMAGE_HDU)
            *status = NOT_TABLE;
    }

    return(*status);
}